

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resources.cpp
# Opt level: O0

shared_ptr<PolledFile> __thiscall Resources::getFile(Resources *this,string *filename)

{
  bool bVar1;
  pointer ppVar2;
  PolledFile *this_00;
  mapped_type *this_01;
  _Base_ptr in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  shared_ptr<PolledFile> sVar4;
  path local_e8;
  path local_a8;
  string local_68;
  string_view local_48;
  undefined1 local_31;
  _Self local_30;
  _Self local_28;
  iterator it;
  string *filename_local;
  Resources *this_local;
  shared_ptr<PolledFile> *file;
  
  it._M_node = in_RDX;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>_>_>
               *)((long)&filename[3].field_2 + 8),in_RDX);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>_>_>
              *)((long)&filename[3].field_2 + 8));
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>_>
             ::operator->(&local_28);
    std::shared_ptr<PolledFile>::shared_ptr((shared_ptr<PolledFile> *)this,&ppVar2->second);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    local_31 = 0;
    this_00 = (PolledFile *)operator_new(0x10);
    std::experimental::filesystem::v1::__cxx11::path::
    path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
              (&local_e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)it._M_node);
    std::experimental::filesystem::v1::__cxx11::operator/(&local_a8,(path *)filename,&local_e8);
    std::experimental::filesystem::v1::__cxx11::path::string(&local_68,&local_a8);
    local_48 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_68);
    PolledFile::PolledFile(this_00,local_48);
    std::shared_ptr<PolledFile>::shared_ptr<PolledFile,void>((shared_ptr<PolledFile> *)this,this_00)
    ;
    std::__cxx11::string::~string((string *)&local_68);
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_a8);
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_e8);
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>_>_>
                            *)((long)&filename[3].field_2 + 8),(key_type *)it._M_node);
    std::shared_ptr<PolledFile>::operator=(this_01,(shared_ptr<PolledFile> *)this);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<PolledFile>)sVar4.super___shared_ptr<PolledFile,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<PolledFile> Resources::getFile(const std::string &filename) {
	const auto it = files_.find(filename);
	if (it != files_.end())
		return it->second;

	auto file = std::shared_ptr<PolledFile>(new PolledFile((project_root_/filename).string()));
	files_[filename] = file;
	return file;
}